

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

char * __thiscall MeCab::anon_unknown_0::TaggerImpl::next(TaggerImpl *this,char *out,size_t len2)

{
  char *pcVar1;
  int iVar2;
  Lattice *pLVar3;
  char *pcVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var;
  
  pLVar3 = mutable_lattice(this);
  iVar2 = (*pLVar3->_vptr_Lattice[0x10])(pLVar3);
  if ((char)iVar2 == '\0') {
    (*pLVar3->_vptr_Lattice[0x25])(pLVar3,"no more results");
    pcVar4 = (char *)0x0;
  }
  else {
    iVar2 = (*pLVar3->_vptr_Lattice[0x1b])(pLVar3,out,len2);
    pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
    if (pcVar4 == (char *)0x0) {
      iVar2 = (*pLVar3->_vptr_Lattice[0x24])(pLVar3);
      pcVar1 = (char *)(this->what_)._M_string_length;
      strlen((char *)CONCAT44(extraout_var_00,iVar2));
      pcVar4 = (char *)0x0;
      std::__cxx11::string::_M_replace((ulong)&this->what_,0,pcVar1,CONCAT44(extraout_var_00,iVar2))
      ;
    }
  }
  return pcVar4;
}

Assistant:

const char* TaggerImpl::next(char *out, size_t len2) {
  Lattice *lattice = mutable_lattice();
  if (!lattice->next()) {
    lattice->set_what("no more results");
    return 0;
  }
  const char *result = lattice->toString(out, len2);
  if (!result) {
    set_what(lattice->what());
    return 0;
  }
  return result;
}